

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetLevelParameterTest::iterate(GetLevelParameterTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar11;
  float fVar12;
  float fVar13;
  GLint result_dsa;
  GLint result_legacy;
  GLuint texture;
  GetLevelParameterTest *local_1d0;
  Enum<int,_2UL> local_1c8;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_1d0 = this;
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    texture = 0;
    (**(code **)(lVar7 + 0x6f8))(1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e11);
    (**(code **)(lVar7 + 0xb8))(0x806f,texture);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e14);
    (**(code **)(lVar7 + 0x1320))(0x806f,0,0x8058,4,4,4,0,0x1908,0x1401,s_texture_data);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e18);
    (**(code **)(lVar7 + 0x1320))(0x806f,1,0x8058,2,2,2,0,0x1908,0x1401,s_texture_data);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    uVar9 = 0x1e1c;
    glu::checkError(dVar5,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e1c);
    bVar2 = true;
    uVar10 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
    uVar9 = 0;
    do {
      lVar11 = 0;
      local_1b8 = uVar10;
      do {
        result_legacy = 0;
        result_dsa = 0;
        iVar4 = *(int *)((long)iterate::pnames + lVar11);
        (**(code **)(lVar7 + 0xab0))(0x806f,uVar9,iVar4,&result_legacy);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e30);
        (**(code **)(lVar7 + 0xae8))(texture,uVar9,iVar4,&result_dsa);
        iVar6 = (**(code **)(lVar7 + 0x800))();
        if (iVar6 == 0) {
          if (result_legacy != result_dsa) {
            local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"For parameter name ",0x13);
            local_1c8.m_getName = glu::getTextureLevelParameterName;
            local_1c8.m_value = iVar4;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," GetTextureLevelParameteriv returned ",0x25);
            std::ostream::operator<<(poVar1,result_dsa);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       ", but reference value (queried using GetTexLevelParameteriv) was ",0x41);
            std::ostream::operator<<(poVar1,result_legacy);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,". Test fails.",0xd);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ac819f;
          }
        }
        else {
          local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetTextureLevelParameteriv unexpectedly generated error ",
                     0x38);
          local_1c8.m_getName = glu::getErrorName;
          local_1c8.m_value = iVar6;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Test fails.",0xd);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ac819f:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          bVar2 = false;
        }
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x3c);
      uVar9 = 1;
      uVar10 = 0;
    } while ((local_1b8 & 1) != 0);
    uVar8 = 1;
    uVar9 = 0;
    do {
      local_1b8 = CONCAT44(local_1b8._4_4_,uVar8);
      lVar11 = 0;
      do {
        result_legacy = 0;
        result_dsa = 0;
        iVar4 = *(int *)((long)iterate::pnames + lVar11);
        (**(code **)(lVar7 + 0xaa8))(0x806f,uVar9,iVar4,&result_legacy);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetTexLevelParameterfv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e5b);
        (**(code **)(lVar7 + 0xae0))(texture,uVar9,iVar4,&result_dsa);
        iVar6 = (**(code **)(lVar7 + 0x800))();
        if (iVar6 == 0) {
          fVar12 = (float)result_legacy - (float)result_dsa;
          fVar13 = -fVar12;
          if (-fVar12 <= fVar12) {
            fVar13 = fVar12;
          }
          if (0.125 < fVar13) {
            local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"For parameter name ",0x13);
            local_1c8.m_getName = glu::getTextureLevelParameterName;
            local_1c8.m_value = iVar4;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," GetTextureLevelParameterfv returned ",0x25);
            std::ostream::_M_insert<double>((double)(float)result_dsa);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       ", but reference value (queried using GetTexLevelParameterfv) was ",0x41);
            std::ostream::_M_insert<double>((double)(float)result_legacy);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,". Test fails.",0xd);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ac83cc;
          }
        }
        else {
          local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetTextureLevelParameterfv unexpectedly generated error ",
                     0x38);
          local_1c8.m_getName = glu::getErrorName;
          local_1c8.m_value = iVar6;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Test fails.",0xd);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ac83cc:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          bVar2 = false;
        }
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x3c);
      uVar9 = 1;
      uVar8 = 0;
    } while ((local_1b8 & 1) != 0);
    if (texture != 0) {
      (**(code **)(lVar7 + 0x480))(1);
    }
    do {
      iVar4 = (**(code **)(lVar7 + 0x800))();
    } while (iVar4 != 0);
    this_00 = (local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetLevelParameterTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture = 0;

	try
	{
		/* Texture initiation. */
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_3D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, s_texture_width, s_texture_height, s_texture_depth, 0, GL_RGBA,
					  GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		gl.texImage3D(GL_TEXTURE_3D, 1, GL_RGBA8, s_texture_width / 2, s_texture_height / 2, s_texture_depth / 2, 0,
					  GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		static const glw::GLenum pnames[] = {
			GL_TEXTURE_WIDTH,	  GL_TEXTURE_HEIGHT,	 GL_TEXTURE_DEPTH,		 GL_TEXTURE_INTERNAL_FORMAT,
			GL_TEXTURE_RED_TYPE,   GL_TEXTURE_GREEN_TYPE, GL_TEXTURE_BLUE_TYPE,  GL_TEXTURE_ALPHA_TYPE,
			GL_TEXTURE_DEPTH_TYPE, GL_TEXTURE_RED_SIZE,   GL_TEXTURE_GREEN_SIZE, GL_TEXTURE_BLUE_SIZE,
			GL_TEXTURE_ALPHA_SIZE, GL_TEXTURE_DEPTH_SIZE, GL_TEXTURE_COMPRESSED
		};
		static const glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

		/* Test GetTextureLevelParameteriv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLint result_legacy = 0;
				glw::GLint result_dsa	= 0;

				/* Quering reference value. */
				gl.getTexLevelParameteriv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameteriv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameteriv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (result_legacy != result_dsa)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameteriv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameteriv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}

		/* Test GetTextureLevelParameterfv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLfloat result_legacy = 0.f;
				glw::GLfloat result_dsa	= 0.f;

				/* Quering reference value. */
				gl.getTexLevelParameterfv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameterfv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameterfv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameterfv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (de::abs(result_legacy - result_dsa) > 0.125 /* Precision. */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameterfv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameterfv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}